

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ml_sse3.c
# Opt level: O3

void av1_nn_propagate_4to8_sse3
               (float *inputs,float *weights,__m128 *out_h,__m128 *out_l,int num_inputs)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  long lVar12;
  __m128 hadd [4];
  
  fVar2 = *inputs;
  fVar3 = inputs[1];
  fVar4 = inputs[2];
  fVar5 = inputs[3];
  lVar12 = 0;
  do {
    fVar6 = weights[2];
    fVar7 = weights[3];
    pfVar1 = weights + num_inputs;
    fVar8 = *pfVar1;
    fVar9 = pfVar1[1];
    fVar10 = pfVar1[2];
    fVar11 = pfVar1[3];
    *(float *)((long)hadd[0] + lVar12) = *weights * fVar2 + weights[1] * fVar3;
    *(float *)((long)hadd[0] + lVar12 + 4) = fVar6 * fVar4 + fVar7 * fVar5;
    *(float *)((long)hadd[0] + lVar12 + 8) = fVar8 * fVar2 + fVar9 * fVar3;
    *(float *)((long)hadd[0] + lVar12 + 0xc) = fVar10 * fVar4 + fVar11 * fVar5;
    weights = weights + (long)num_inputs * 2;
    lVar12 = lVar12 + 0x10;
  } while (lVar12 != 0x40);
  fVar2 = (*out_h)[1];
  fVar3 = (*out_h)[2];
  fVar4 = (*out_h)[3];
  (*out_h)[0] = hadd[2][0] + hadd[2][1] + (*out_h)[0];
  (*out_h)[1] = hadd[2][2] + hadd[2][3] + fVar2;
  (*out_h)[2] = hadd[3][0] + hadd[3][1] + fVar3;
  (*out_h)[3] = hadd[3][2] + hadd[3][3] + fVar4;
  fVar2 = (*out_l)[1];
  fVar3 = (*out_l)[2];
  fVar4 = (*out_l)[3];
  (*out_l)[0] = hadd[0][0] + hadd[0][1] + (*out_l)[0];
  (*out_l)[1] = hadd[0][2] + hadd[0][3] + fVar2;
  (*out_l)[2] = hadd[1][0] + hadd[1][1] + fVar3;
  (*out_l)[3] = hadd[1][2] + hadd[1][3] + fVar4;
  return;
}

Assistant:

void av1_nn_propagate_4to8_sse3(const float *const inputs,
                                const float *const weights, __m128 *const out_h,
                                __m128 *const out_l, const int num_inputs) {
  const __m128 inputs128 = _mm_loadu_ps(inputs);

  __m128 hadd[4];
  for (int i = 0; i < 4; i++) {  // For each pair of outputs
    const __m128 weight0 = _mm_loadu_ps(&weights[2 * i * num_inputs]);
    const __m128 weight1 = _mm_loadu_ps(&weights[(2 * i + 1) * num_inputs]);
    const __m128 mul0 = _mm_mul_ps(inputs128, weight0);
    const __m128 mul1 = _mm_mul_ps(inputs128, weight1);
    hadd[i] = _mm_hadd_ps(mul0, mul1);
  }
  // hadd[0] = [7+6 5+4 3+2 1+0] (weight indices)
  // hadd[1] = [15+14 13+12 11+10 9+8]
  // hadd[2] = [23+22 21+20 19+18 17+16]
  // hadd[3] = [31+30 29+28 27+26 25+24]

  const __m128 hh0 = _mm_hadd_ps(hadd[0], hadd[1]);
  // [15+14+13+12 11+10+9+8 7+6+5+4 3+2+1+0]
  const __m128 hh1 = _mm_hadd_ps(hadd[2], hadd[3]);
  // [31+30+29+28 27+26+25+24 23+22+21+20 19+18+17+16]

  *out_h = _mm_add_ps(*out_h, hh1);
  *out_l = _mm_add_ps(*out_l, hh0);
}